

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall
TPZEqnArray<std::complex<double>_>::EqnForward
          (TPZEqnArray<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *F,
          DecomposeType dec)

{
  double dVar1;
  ostream *poVar2;
  complex<double> *pcVar3;
  complex<double> *pcVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar10;
  complex<double> udiag;
  
  if (this->fSymmetric == EIsSymmetric) {
    uVar8 = 0;
    while( true ) {
      dVar10 = 0.0;
      if ((long)this->fNumEq <= (long)uVar8) break;
      iVar7 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar8];
      lVar5 = (long)iVar7;
      pcVar4 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
               super_TPZVec<std::complex<double>_>.fStore;
      dVar1 = *(double *)pcVar4[lVar5]._M_value;
      if ((((dVar1 == 0.0) && (!NAN(dVar1))) &&
          (dVar1 = *(double *)(pcVar4[lVar5]._M_value + 8), dVar1 == 0.0)) && (!NAN(dVar1))) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ")
        ;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
        poVar2 = std::operator<<(poVar2," Equation = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar8);
        std::endl<char,std::char_traits<char>>(poVar2);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                   ,0x8b);
      }
      if (uVar8 == this->fNumEq - 1) {
        iVar7 = (int)(this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                     super_TPZVec<std::complex<double>_>.fNElements;
      }
      else {
        iVar7 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar8 + 1];
      }
      if ((dec & ~ELUPivot) == ELU) {
        pcVar4 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                 super_TPZVec<std::complex<double>_>.fStore;
        pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar5],0);
        std::complex<double>::operator/=(pcVar3,pcVar4 + lVar5);
      }
      pcVar4 = TPZFMatrix<std::complex<double>_>::operator()
                         (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                  fStore[lVar5],0);
      udiag._M_value._0_8_ = *(undefined8 *)pcVar4->_M_value;
      udiag._M_value._8_8_ = *(undefined8 *)(pcVar4->_M_value + 8);
      lVar6 = lVar5;
      lVar9 = lVar5 * 0x10;
      while( true ) {
        lVar6 = lVar6 + 1;
        if (iVar7 <= lVar6) break;
        std::operator*(&udiag,(complex<double> *)
                              ((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                               super_TPZVec<std::complex<double>_>.fStore[1]._M_value + lVar9));
        pcVar4 = TPZFMatrix<std::complex<double>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar6],0);
        dVar1 = *(double *)(pcVar4->_M_value + 8);
        *(double *)pcVar4->_M_value = *(double *)pcVar4->_M_value - extraout_XMM0_Qa_00;
        *(double *)(pcVar4->_M_value + 8) = dVar1 - dVar10;
        dVar10 = extraout_XMM0_Qa_00;
        lVar9 = lVar9 + 0x10;
      }
      if (dec == ELDLt) {
        pcVar4 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                 super_TPZVec<std::complex<double>_>.fStore;
        pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar5],0);
        std::complex<double>::operator/=(pcVar3,pcVar4 + lVar5);
      }
      uVar8 = uVar8 + 1;
    }
  }
  else if (this->fSymmetric == EIsNonSymmetric) {
    uVar8 = 1;
    while( true ) {
      dVar10 = 0.0;
      if ((long)this->fNumEq <= (long)uVar8) break;
      iVar7 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar8];
      lVar5 = (long)iVar7;
      pcVar4 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
               super_TPZVec<std::complex<double>_>.fStore;
      dVar1 = *(double *)pcVar4[lVar5]._M_value;
      if (((dVar1 == 0.0) && (!NAN(dVar1))) &&
         ((dVar1 = *(double *)(pcVar4[lVar5]._M_value + 8), dVar1 == 0.0 && (!NAN(dVar1))))) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ")
        ;
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
        poVar2 = std::operator<<(poVar2," Equation = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar8);
        std::endl<char,std::char_traits<char>>(poVar2);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                   ,0xa5);
      }
      if (uVar8 == this->fNumEq - 1) {
        iVar7 = (int)(this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                     super_TPZVec<std::complex<double>_>.fNElements;
      }
      else {
        iVar7 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar8 + 1];
      }
      if ((dec & ~ELUPivot) == ELU) {
        pcVar4 = (this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                 super_TPZVec<std::complex<double>_>.fStore;
        pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar5],0);
        std::complex<double>::operator/=(pcVar3,pcVar4 + lVar5);
      }
      pcVar4 = TPZFMatrix<std::complex<double>_>::operator()
                         (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                  fStore[lVar5],0);
      udiag._M_value._0_8_ = *(undefined8 *)pcVar4->_M_value;
      udiag._M_value._8_8_ = *(undefined8 *)(pcVar4->_M_value + 8);
      lVar6 = lVar5 * 0x10;
      while( true ) {
        lVar5 = lVar5 + 1;
        if (iVar7 <= lVar5) break;
        std::operator*(&udiag,(complex<double> *)
                              ((this->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                               super_TPZVec<std::complex<double>_>.fStore[1]._M_value + lVar6));
        pcVar4 = TPZFMatrix<std::complex<double>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar5],0);
        dVar1 = *(double *)(pcVar4->_M_value + 8);
        *(double *)pcVar4->_M_value = *(double *)pcVar4->_M_value - extraout_XMM0_Qa;
        *(double *)(pcVar4->_M_value + 8) = dVar1 - dVar10;
        lVar6 = lVar6 + 0x10;
        dVar10 = extraout_XMM0_Qa;
      }
      uVar8 = uVar8 + 2;
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}